

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha512.c
# Opt level: O2

void decaf_sha512_final(decaf_sha512_ctx_s *ctx,uint8_t *out,size_t length)

{
  uint8_t *__s;
  uint64_t uVar1;
  byte bVar2;
  uint8_t *puVar3;
  long lVar4;
  ulong uVar5;
  
  if (length < 0x41) {
    uVar1 = ctx->bytes_processed;
    uVar5 = (ulong)((uint)uVar1 & 0x7f);
    __s = ctx->block;
    ctx->block[uVar5] = 0x80;
    memset(ctx->block + uVar5 + 1,0,uVar5 ^ 0x7f);
    if (0x6f < uVar5) {
      hashblock(ctx);
      ctx->block[0x70] = '\0';
      ctx->block[0x71] = '\0';
      ctx->block[0x72] = '\0';
      ctx->block[0x73] = '\0';
      ctx->block[0x74] = '\0';
      ctx->block[0x75] = '\0';
      ctx->block[0x76] = '\0';
      ctx->block[0x77] = '\0';
      ctx->block[0x78] = '\0';
      ctx->block[0x79] = '\0';
      ctx->block[0x7a] = '\0';
      ctx->block[0x7b] = '\0';
      ctx->block[0x7c] = '\0';
      ctx->block[0x7d] = '\0';
      ctx->block[0x7e] = '\0';
      ctx->block[0x7f] = '\0';
      ctx->block[0x60] = '\0';
      ctx->block[0x61] = '\0';
      ctx->block[0x62] = '\0';
      ctx->block[99] = '\0';
      ctx->block[100] = '\0';
      ctx->block[0x65] = '\0';
      ctx->block[0x66] = '\0';
      ctx->block[0x67] = '\0';
      ctx->block[0x68] = '\0';
      ctx->block[0x69] = '\0';
      ctx->block[0x6a] = '\0';
      ctx->block[0x6b] = '\0';
      ctx->block[0x6c] = '\0';
      ctx->block[0x6d] = '\0';
      ctx->block[0x6e] = '\0';
      ctx->block[0x6f] = '\0';
      ctx->block[0x50] = '\0';
      ctx->block[0x51] = '\0';
      ctx->block[0x52] = '\0';
      ctx->block[0x53] = '\0';
      ctx->block[0x54] = '\0';
      ctx->block[0x55] = '\0';
      ctx->block[0x56] = '\0';
      ctx->block[0x57] = '\0';
      ctx->block[0x58] = '\0';
      ctx->block[0x59] = '\0';
      ctx->block[0x5a] = '\0';
      ctx->block[0x5b] = '\0';
      ctx->block[0x5c] = '\0';
      ctx->block[0x5d] = '\0';
      ctx->block[0x5e] = '\0';
      ctx->block[0x5f] = '\0';
      ctx->block[0x40] = '\0';
      ctx->block[0x41] = '\0';
      ctx->block[0x42] = '\0';
      ctx->block[0x43] = '\0';
      ctx->block[0x44] = '\0';
      ctx->block[0x45] = '\0';
      ctx->block[0x46] = '\0';
      ctx->block[0x47] = '\0';
      ctx->block[0x48] = '\0';
      ctx->block[0x49] = '\0';
      ctx->block[0x4a] = '\0';
      ctx->block[0x4b] = '\0';
      ctx->block[0x4c] = '\0';
      ctx->block[0x4d] = '\0';
      ctx->block[0x4e] = '\0';
      ctx->block[0x4f] = '\0';
      ctx->block[0x30] = '\0';
      ctx->block[0x31] = '\0';
      ctx->block[0x32] = '\0';
      ctx->block[0x33] = '\0';
      ctx->block[0x34] = '\0';
      ctx->block[0x35] = '\0';
      ctx->block[0x36] = '\0';
      ctx->block[0x37] = '\0';
      ctx->block[0x38] = '\0';
      ctx->block[0x39] = '\0';
      ctx->block[0x3a] = '\0';
      ctx->block[0x3b] = '\0';
      ctx->block[0x3c] = '\0';
      ctx->block[0x3d] = '\0';
      ctx->block[0x3e] = '\0';
      ctx->block[0x3f] = '\0';
      ctx->block[0x20] = '\0';
      ctx->block[0x21] = '\0';
      ctx->block[0x22] = '\0';
      ctx->block[0x23] = '\0';
      ctx->block[0x24] = '\0';
      ctx->block[0x25] = '\0';
      ctx->block[0x26] = '\0';
      ctx->block[0x27] = '\0';
      ctx->block[0x28] = '\0';
      ctx->block[0x29] = '\0';
      ctx->block[0x2a] = '\0';
      ctx->block[0x2b] = '\0';
      ctx->block[0x2c] = '\0';
      ctx->block[0x2d] = '\0';
      ctx->block[0x2e] = '\0';
      ctx->block[0x2f] = '\0';
      ctx->block[0x10] = '\0';
      ctx->block[0x11] = '\0';
      ctx->block[0x12] = '\0';
      ctx->block[0x13] = '\0';
      ctx->block[0x14] = '\0';
      ctx->block[0x15] = '\0';
      ctx->block[0x16] = '\0';
      ctx->block[0x17] = '\0';
      ctx->block[0x18] = '\0';
      ctx->block[0x19] = '\0';
      ctx->block[0x1a] = '\0';
      ctx->block[0x1b] = '\0';
      ctx->block[0x1c] = '\0';
      ctx->block[0x1d] = '\0';
      ctx->block[0x1e] = '\0';
      ctx->block[0x1f] = '\0';
      __s[0] = '\0';
      __s[1] = '\0';
      __s[2] = '\0';
      __s[3] = '\0';
      __s[4] = '\0';
      __s[5] = '\0';
      __s[6] = '\0';
      __s[7] = '\0';
      ctx->block[8] = '\0';
      ctx->block[9] = '\0';
      ctx->block[10] = '\0';
      ctx->block[0xb] = '\0';
      ctx->block[0xc] = '\0';
      ctx->block[0xd] = '\0';
      ctx->block[0xe] = '\0';
      ctx->block[0xf] = '\0';
    }
    puVar3 = ctx->block + 0x78;
    for (lVar4 = 0x38; lVar4 != -8; lVar4 = lVar4 + -8) {
      *puVar3 = (uint8_t)((uVar1 << 3) >> ((byte)lVar4 & 0x3f));
      puVar3 = puVar3 + 1;
    }
    hashblock(ctx);
    bVar2 = 0;
    for (uVar5 = 0; length != uVar5; uVar5 = uVar5 + 1) {
      out[uVar5] = (uint8_t)(*(ulong *)((long)ctx->state + (uVar5 & 0xfffffffffffffff8)) >>
                            (~bVar2 & 0x38));
      bVar2 = bVar2 + 8;
    }
    ctx->state[6] = 0x1f83d9abfb41bd6b;
    ctx->state[7] = 0x5be0cd19137e2179;
    ctx->state[4] = 0x510e527fade682d1;
    ctx->state[5] = 0x9b05688c2b3e6c1f;
    ctx->state[2] = 0x3c6ef372fe94f82b;
    ctx->state[3] = 0xa54ff53a5f1d36f1;
    ctx->state[0] = 0x6a09e667f3bcc908;
    ctx->state[1] = 0xbb67ae8584caa73b;
    memset(__s,0,0x88);
    return;
  }
  __assert_fail("length <= 512/8",
                "/workspace/llm4binary/github/license_all_cmakelists_25/potatosalad[P]ed448goldilocks/src/sha512.c"
                ,0xe9,"void decaf_sha512_final(struct decaf_sha512_ctx_s *, uint8_t *, size_t)");
}

Assistant:

void decaf_sha512_final(decaf_sha512_ctx_t ctx, uint8_t *out, size_t length) {
    assert(length <= 512/8);
    
    size_t off = ctx->bytes_processed % 128;
    uint64_t bp = ctx->bytes_processed * 8;
    ctx->block[off] = 0x80;
    memset(&ctx->block[off+1], 0, 128-off-1);
    
    if (off >= 112) {
        hashblock(ctx);
        memset(&ctx->block,0,128);
    }
    
    for (size_t i=0; i<8; i++)
        ctx->block[120 + i] = (uint8_t)(bp >> (56 - 8*i));
    hashblock(ctx);
    
    for (size_t i=0; i<length; i++) {
        out[i] = (uint8_t)(ctx->state[i/8] >> (56 - 8*(i%8)));
    }
    
    decaf_sha512_init(ctx);
}